

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O2

void __thiscall BaseComponent::Run(BaseComponent *this)

{
  mutex *__mutex;
  _Elt_pointer ppEVar1;
  Event *pEVar2;
  bool bVar3;
  
  (*(this->super_BaseStoppable).super_BaseThread._vptr_BaseThread[1])();
  __mutex = &this->queueLock;
  while( true ) {
    bVar3 = BaseStoppable::Stopping(&this->super_BaseStoppable);
    if (bVar3) break;
    bVar3 = std::mutex::try_lock(__mutex);
    if (bVar3) {
      ppEVar1 = (this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      if ((this->queue).c.super__Deque_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur == ppEVar1) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        pEVar2 = *ppEVar1;
        std::deque<Event_*,_std::allocator<Event_*>_>::pop_front(&(this->queue).c);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        (*(this->super_BaseStoppable).super_BaseThread._vptr_BaseThread[3])(this,pEVar2);
        if (pEVar2 != (Event *)0x0) {
          (*pEVar2->_vptr_Event[1])(pEVar2);
        }
      }
    }
    (*(this->super_BaseStoppable).super_BaseThread._vptr_BaseThread[2])(this);
  }
  (*(this->super_BaseStoppable).super_BaseThread._vptr_BaseThread[4])(this);
  return;
}

Assistant:

void BaseComponent::Run() {
    Init();

    while(!Stopping()) {
        if(queueLock.try_lock()) {
            if(queue.empty()) {
                queueLock.unlock();
            } else {
                Event *ev = queue.front();
                queue.pop();

                queueLock.unlock();

                Handler(ev);
                delete ev;
            }
        }

        Process();
    }

    End();
}